

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAndroidExtensionPackES31ATests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImplementationLimitCase::iterate
          (ImplementationLimitCase *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  GLenum err;
  undefined4 extraout_var;
  char *__s;
  size_t sVar4;
  StateQueryMemoryWriteGuard<int> result;
  CallLogWrapper gl;
  StateQueryMemoryWriteGuard<int> local_1c0;
  CallLogWrapper local_1b0;
  undefined1 local_198 [384];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_1b0,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  local_1c0.m_preguard = -0x21212122;
  local_1c0.m_value = -0x21212122;
  local_1c0.m_postguard = -0x21212122;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Querying ",9);
  __s = glu::getGettableStateName(this->m_target);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_198._8_8_ + -0x18));
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expecting at least ",0x15)
  ;
  std::ostream::operator<<(poVar1,this->m_minValue);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
  local_1b0.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&local_1b0,this->m_target,&local_1c0.m_value);
  err = glu::CallLogWrapper::glGetError(&local_1b0);
  glu::checkError(err,"implementation limit query failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAndroidExtensionPackES31ATests.cpp"
                  ,0x68);
  bVar2 = gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&local_1c0,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((bVar2) && (local_1c0.m_value < this->m_minValue)) {
    local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"// ERROR: Got ",0xe);
    std::ostream::operator<<(poVar1,local_1c0.m_value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,", expected at least ",0x14);
    std::ostream::operator<<(poVar1,this->m_minValue);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Too low implementation limit");
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_1b0);
  return STOP;
}

Assistant:

ImplementationLimitCase::IterateResult ImplementationLimitCase::iterate (void)
{
	using namespace gls::StateQueryUtil;

	glu::CallLogWrapper						gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	StateQueryMemoryWriteGuard<glw::GLint>	result;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Querying " << glu::getGettableStateName(m_target) << ", expecting at least " << m_limit
		<< tcu::TestLog::EndMessage;

	gl.enableLogging(true);
	gl.glGetIntegerv(m_target, &result);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "implementation limit query failed");

	if (result.verifyValidity(m_testCtx) && result < m_limit)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "// ERROR: Got " << result << ", expected at least " << m_limit
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Too low implementation limit");
	}

	return STOP;
}